

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_positional_scan.cpp
# Opt level: O3

SourceResultType __thiscall
duckdb::PhysicalPositionalScan::GetData
          (PhysicalPositionalScan *this,ExecutionContext *context,DataChunk *output,
          OperatorSourceInput *input)

{
  LocalSourceState *pLVar1;
  unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
  *puVar2;
  SourceResultType SVar3;
  pointer pPVar4;
  idx_t count;
  idx_t iVar5;
  unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
  *scanner;
  unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
  *puVar6;
  idx_t col_offset;
  ulong uVar7;
  
  pLVar1 = input->local_state;
  puVar6 = (unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
            *)pLVar1[1]._vptr_LocalSourceState;
  puVar2 = (unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
            *)pLVar1[2]._vptr_LocalSourceState;
  SVar3 = FINISHED;
  if (puVar6 != puVar2) {
    uVar7 = 0;
    do {
      pPVar4 = unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
               ::operator->(puVar6);
      count = PositionalTableScanner::Refill(pPVar4,context);
      if (count < uVar7) {
        count = uVar7;
      }
      puVar6 = puVar6 + 1;
      uVar7 = count;
    } while (puVar6 != puVar2);
    SVar3 = FINISHED;
    if (count != 0) {
      puVar6 = (unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
                *)pLVar1[1]._vptr_LocalSourceState;
      puVar2 = (unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
                *)pLVar1[2]._vptr_LocalSourceState;
      if (puVar6 != puVar2) {
        col_offset = 0;
        do {
          pPVar4 = unique_ptr<duckdb::PositionalTableScanner,_std::default_delete<duckdb::PositionalTableScanner>,_true>
                   ::operator->(puVar6);
          iVar5 = PositionalTableScanner::CopyData(pPVar4,context,output,count,col_offset);
          col_offset = col_offset + iVar5;
          puVar6 = puVar6 + 1;
        } while (puVar6 != puVar2);
      }
      output->count = count;
      SVar3 = HAVE_MORE_OUTPUT;
    }
  }
  return SVar3;
}

Assistant:

SourceResultType PhysicalPositionalScan::GetData(ExecutionContext &context, DataChunk &output,
                                                 OperatorSourceInput &input) const {
	auto &lstate = input.local_state.Cast<PositionalScanLocalSourceState>();

	// Find the longest source block
	idx_t count = 0;
	for (auto &scanner : lstate.scanners) {
		count = MaxValue(count, scanner->Refill(context));
	}

	//	All done?
	if (!count) {
		return SourceResultType::FINISHED;
	}

	// Copy or reference the source columns
	idx_t col_offset = 0;
	for (auto &scanner : lstate.scanners) {
		col_offset += scanner->CopyData(context, output, count, col_offset);
	}

	output.SetCardinality(count);
	return SourceResultType::HAVE_MORE_OUTPUT;
}